

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

string_type * __thiscall
booster::locale::basic_message<char>::str_abi_cxx11_
          (string_type *__return_storage_ptr__,basic_message<char> *this,locale *loc,int id)

{
  char *pcVar1;
  char *__s;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __s = (char *)write(this,(int)loc,(void *)(ulong)(uint)id,(size_t)__return_storage_ptr__);
  if (__s != (__return_storage_ptr__->_M_dataplus)._M_p) {
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)__s);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type str(std::locale const &loc,int id) const
            {
                string_type buffer;                
                char_type const *ptr = write(loc,id,buffer);
                if(ptr == buffer.c_str())
                    return buffer;
                else
                    buffer = ptr;
                return buffer;
            }